

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.h
# Opt level: O1

void __thiscall Delay::Delay(Delay *this,unsigned_long _ms)

{
  int iVar1;
  long lVar2;
  long lVar3;
  Delay *this_00;
  long lVar4;
  
  (this->super_Promise).super_enable_shared_from_this<Promise>._M_weak_this.
  super___weak_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Promise).super_enable_shared_from_this<Promise>._M_weak_this.
  super___weak_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Promise)._vptr_Promise = (_func_int **)&PTR_Tick_00108c68;
  *(undefined8 *)&(this->super_Promise).manually_resolved_handler.super__Function_base._M_functor =
       0;
  *(undefined8 *)
   ((long)&(this->super_Promise).manually_resolved_handler.super__Function_base._M_functor + 8) = 0;
  (this->super_Promise).manually_resolved_handler.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->super_Promise).manually_resolved_handler._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->super_Promise).auto_resolved_handler.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->super_Promise).auto_resolved_handler.super__Function_base._M_functor + 8) = 0;
  (this->super_Promise).auto_resolved_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Promise).auto_resolved_handler._M_invoker = (_Invoker_type)0x0;
  (this->super_Promise).handler_ran = false;
  *(undefined8 *)&(this->super_Promise).state = 0;
  *(undefined8 *)((long)&(this->super_Promise).data + 4) = 0;
  *(undefined8 *)((long)&(this->super_Promise).passed_value + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_Promise).parent.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_Promise).parent.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_Promise).children.
           super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_Promise).children.
           super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_Promise).children.
           super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_Promise).is_registered = false;
  iVar1 = Promise::_init()::id_counter + 1;
  (this->super_Promise).id = Promise::_init()::id_counter;
  Promise::_init()::id_counter = iVar1;
  (this->super_Promise)._vptr_Promise = (_func_int **)&PTR_Tick_00108d08;
  this->ms = _ms;
  (this->target_time).__d.__r = 0;
  this_00 = this;
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar4 = this->ms * 1000000;
  (this->target_time).__d.__r = lVar2 + lVar4;
  if (timestamp()::prev == '\0') {
    Delay(this_00);
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar3 = lVar2 - timestamp()::prev;
  timestamp()::prev = lVar2;
  printf("%lli: ",lVar3 / 1000000);
  printf("Time diff: %f\n",SUB84((double)lVar4 / 1000000000.0,0));
  return;
}

Assistant:

explicit Delay(unsigned long _ms): ms(_ms), Promise() {
    const time_point& time = std::chrono::system_clock::now();
    target_time = time + std::chrono::milliseconds(ms);
    std::chrono::duration<double> duration = target_time - time;
    timestamp(); printf("Time diff: %f\n", duration.count());
  }